

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O1

DFsSection * __thiscall DFsScript::FindSectionStart(DFsScript *this,char *brace)

{
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar2;
  int iVar3;
  
  iVar3 = ((int)brace - *(int *)&this->data) % 0x11;
  aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)this->sections[iVar3].field_0.p;
  if ((aVar1.p != (DFsSection *)0x0) && ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) != 0)) {
    this->sections[iVar3].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)0x0;
    aVar1.p = (DFsSection *)0x0;
  }
  while( true ) {
    aVar2 = aVar1;
    if (aVar2.p == (DFsSection *)0x0) {
      return (DFsSection *)0x0;
    }
    if (this->data + (aVar2.p)->start_index == brace) break;
    aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)((aVar2.p)->next).field_0.p;
    if ((aVar1.p != (DFsSection *)0x0) && ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) != 0)) {
      ((aVar2.p)->next).field_0.p = (DFsSection *)0x0;
      aVar1.p = (DFsSection *)0x0;
    }
  }
  return aVar2.p;
}

Assistant:

DFsSection *DFsScript::FindSectionStart(const char *brace)
{
	int n = section_hash(brace);
	DFsSection *current = sections[n];
	
	// use the hash table: check the appropriate hash chain
	
	while(current)
    {
		if(SectionStart(current) == brace) return current;
		current = current->next;
    }
	
	return NULL;    // not found
}